

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

void stbir__calculate_filters
               (stbir__contributors *contributors,float *coefficients,stbir_filter filter,
               float scale_ratio,float shift,int input_size,int output_size)

{
  int iVar1;
  int out_center_of_in_00;
  float in_first_pixel_00;
  int scale_ratio_00;
  float filter_00;
  int iVar2;
  stbir__contributors *psVar3;
  float *pfVar4;
  float fVar5;
  int local_54;
  int n_adjusted;
  int out_last_pixel;
  int out_first_pixel;
  float out_center_of_in;
  float in_pixels_radius;
  int in_last_pixel;
  int in_first_pixel;
  float in_center_of_out;
  float out_pixels_radius;
  int total_contributors;
  int n;
  int output_size_local;
  int input_size_local;
  float shift_local;
  float scale_ratio_local;
  stbir_filter filter_local;
  float *coefficients_local;
  stbir__contributors *contributors_local;
  
  total_contributors = output_size;
  n = input_size;
  output_size_local = (int)shift;
  input_size_local = (int)scale_ratio;
  shift_local = (float)filter;
  _scale_ratio_local = coefficients;
  coefficients_local = (float *)contributors;
  in_center_of_out = (float)stbir__get_contributors(scale_ratio,filter,input_size,output_size);
  iVar2 = stbir__use_upsampling((float)input_size_local);
  if (iVar2 == 0) {
    fVar5 = (*stbir__filter_info_table[(uint)shift_local].support)((float)input_size_local);
    out_first_pixel = (int)(fVar5 / (float)input_size_local);
    for (out_pixels_radius = 0.0; fVar5 = out_pixels_radius,
        (int)out_pixels_radius < (int)in_center_of_out;
        out_pixels_radius = (float)((int)out_pixels_radius + 1)) {
      iVar2 = stbir__get_filter_pixel_margin((stbir_filter)shift_local,(float)input_size_local);
      stbir__calculate_sample_range_downsample
                ((int)fVar5 - iVar2,(float)out_first_pixel,(float)input_size_local,
                 (float)output_size_local,&n_adjusted,&local_54,(float *)&out_last_pixel);
      fVar5 = shift_local;
      scale_ratio_00 = input_size_local;
      out_center_of_in_00 = out_last_pixel;
      iVar1 = n_adjusted;
      iVar2 = local_54;
      psVar3 = stbir__get_contributor
                         ((stbir__contributors *)coefficients_local,(int)out_pixels_radius);
      pfVar4 = stbir__get_coefficient
                         (_scale_ratio_local,(stbir_filter)shift_local,(float)input_size_local,
                          (int)out_pixels_radius,0);
      stbir__calculate_coefficients_downsample
                ((stbir_filter)fVar5,(float)scale_ratio_00,iVar1,iVar2,(float)out_center_of_in_00,
                 psVar3,pfVar4);
    }
    stbir__normalize_downsample_coefficients
              ((stbir__contributors *)coefficients_local,_scale_ratio_local,
               (stbir_filter)shift_local,(float)input_size_local,n,total_contributors);
  }
  else {
    fVar5 = (*stbir__filter_info_table[(uint)shift_local].support)(1.0 / (float)input_size_local);
    in_first_pixel = (int)(fVar5 * (float)input_size_local);
    for (out_pixels_radius = 0.0; (int)out_pixels_radius < (int)in_center_of_out;
        out_pixels_radius = (float)((int)out_pixels_radius + 1)) {
      stbir__calculate_sample_range_upsample
                ((int)out_pixels_radius,(float)in_first_pixel,(float)input_size_local,
                 (float)output_size_local,(int *)&in_pixels_radius,(int *)&out_center_of_in,
                 (float *)&in_last_pixel);
      filter_00 = shift_local;
      iVar1 = input_size_local;
      iVar2 = in_last_pixel;
      in_first_pixel_00 = in_pixels_radius;
      fVar5 = out_center_of_in;
      psVar3 = stbir__get_contributor
                         ((stbir__contributors *)coefficients_local,(int)out_pixels_radius);
      pfVar4 = stbir__get_coefficient
                         (_scale_ratio_local,(stbir_filter)shift_local,(float)input_size_local,
                          (int)out_pixels_radius,0);
      stbir__calculate_coefficients_upsample
                ((stbir_filter)filter_00,(float)iVar1,(int)in_first_pixel_00,(int)fVar5,(float)iVar2
                 ,psVar3,pfVar4);
    }
  }
  return;
}

Assistant:

static void stbir__calculate_filters(stbir__contributors* contributors, float* coefficients, stbir_filter filter, float scale_ratio, float shift, int input_size, int output_size)
{
    int n;
    int total_contributors = stbir__get_contributors(scale_ratio, filter, input_size, output_size);

    if (stbir__use_upsampling(scale_ratio))
    {
        float out_pixels_radius = stbir__filter_info_table[filter].support(1 / scale_ratio) * scale_ratio;

        // Looping through out pixels
        for (n = 0; n < total_contributors; n++)
        {
            float in_center_of_out; // Center of the current out pixel in the in pixel space
            int in_first_pixel, in_last_pixel;

            stbir__calculate_sample_range_upsample(n, out_pixels_radius, scale_ratio, shift, &in_first_pixel, &in_last_pixel, &in_center_of_out);

            stbir__calculate_coefficients_upsample(filter, scale_ratio, in_first_pixel, in_last_pixel, in_center_of_out, stbir__get_contributor(contributors, n), stbir__get_coefficient(coefficients, filter, scale_ratio, n, 0));
        }
    }
    else
    {
        float in_pixels_radius = stbir__filter_info_table[filter].support(scale_ratio) / scale_ratio;

        // Looping through in pixels
        for (n = 0; n < total_contributors; n++)
        {
            float out_center_of_in; // Center of the current out pixel in the in pixel space
            int out_first_pixel, out_last_pixel;
            int n_adjusted = n - stbir__get_filter_pixel_margin(filter, scale_ratio);

            stbir__calculate_sample_range_downsample(n_adjusted, in_pixels_radius, scale_ratio, shift, &out_first_pixel, &out_last_pixel, &out_center_of_in);

            stbir__calculate_coefficients_downsample(filter, scale_ratio, out_first_pixel, out_last_pixel, out_center_of_in, stbir__get_contributor(contributors, n), stbir__get_coefficient(coefficients, filter, scale_ratio, n, 0));
        }

        stbir__normalize_downsample_coefficients(contributors, coefficients, filter, scale_ratio, input_size, output_size);
    }
}